

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# execmd.c
# Opt level: O1

void vocremfd(voccxdef *ctx,vocddef *what,objnum func,prpnum prop,runsdef *val,int err)

{
  uint uVar1;
  int iVar2;
  long lVar3;
  int iVar4;
  
  if (ctx->voccxdmn == what) {
    lVar3 = 0xf00;
  }
  else if (ctx->voccxalm == what) {
    lVar3 = 0xf20;
  }
  else {
    lVar3 = 0xf10;
    if (ctx->voccxfus != what) {
      errsigf(ctx->voccxerr,"TADS",0x40b);
    }
  }
  iVar4 = *(int *)((long)ctx->voccxinh + lVar3 + -0x58);
  if (iVar4 != 0) {
    do {
      if ((what->vocdfn == func) && (what->vocdprp == prop)) {
        if (val == (runsdef *)0x0) {
LAB_001ef79f:
          vocdusav(ctx,what);
          what->vocdfn = 0xffff;
          return;
        }
        if (val->runstyp == (what->vocdarg).runstyp) {
          uVar1 = datsiz((uint)val->runstyp,&val->runsv);
          iVar2 = bcmp(&val->runsv,&(what->vocdarg).runsv,(ulong)uVar1);
          if (iVar2 == 0) goto LAB_001ef79f;
        }
      }
      what = what + 1;
      iVar4 = iVar4 + -1;
    } while (iVar4 != 0);
  }
  return;
}

Assistant:

void vocremfd(voccxdef *ctx, vocddef *what, objnum func, prpnum prop,
              runsdef *val, int err)
{
    int      slots;
    
    if (what == ctx->voccxdmn) slots = ctx->voccxdmc;
    else if (what == ctx->voccxalm) slots = ctx->voccxalc;
    else if (what == ctx->voccxfus) slots = ctx->voccxfuc;
    else errsig(ctx->voccxerr, ERR_BADREMF);
    
    /* find the slot with this same fuse/daemon/notifier, and remove it */
    for ( ; slots ; ++what, --slots)
    {
        if (what->vocdfn == func
            && what->vocdprp == prop
            && (!val || (val->runstyp == what->vocdarg.runstyp
                         && !memcmp(&val->runsv, &what->vocdarg.runsv,
                                    (size_t)datsiz(val->runstyp,
                                                   &val->runsv)))))
        {
            /* save an undo record for this slot before changing */
            vocdusav(ctx, what);

            what->vocdfn = MCMONINV;
            return;
        }
    }

/*    errsig(ctx->voccxerr, err); <<<harmless - don't signal it>>> */
}